

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
          (QCommonArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  FunctionDef *pFVar1;
  FunctionDef **data;
  QArrayDataPointer<FunctionDef> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<FunctionDef> local_38;
  FunctionDef *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (FunctionDef *)0x0;
    local_38.size = 0;
    pFVar1 = (this->super_Type).super_QGenericArrayOps<FunctionDef>.
             super_QArrayDataPointer<FunctionDef>.ptr;
    if ((b < pFVar1) ||
       (pFVar1 + (this->super_Type).super_QGenericArrayOps<FunctionDef>.
                 super_QArrayDataPointer<FunctionDef>.size <= b)) {
      data = (FunctionDef **)0x0;
      old = (QArrayDataPointer<FunctionDef> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<FunctionDef>::detachAndGrow
              ((QArrayDataPointer<FunctionDef> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 4) * 0x4ec4ec4ec4ec4ec5,data,old);
    QGenericArrayOps<FunctionDef>::copyAppend
              ((QGenericArrayOps<FunctionDef> *)this,local_20,
               (FunctionDef *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<FunctionDef>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }